

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

void __thiscall pg::Game::unsafe_permute(Game *this,int *mapping)

{
  byte bVar1;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [24];
  undefined1 local_d0 [7];
  bool b_2;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [24];
  undefined1 local_88 [7];
  bool b_1;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [31];
  bool b;
  int k;
  int i_3;
  unsigned_long i_2;
  unsigned_long i_1;
  unsigned_long len;
  int *piStack_18;
  int i;
  int *mapping_local;
  Game *this_local;
  
  for (len._4_4_ = 0; (long)len._4_4_ < this->n_vertices; len._4_4_ = len._4_4_ + 1) {
    if (this->strategy[len._4_4_] != -1) {
      this->strategy[len._4_4_] = mapping[this->strategy[len._4_4_]];
    }
  }
  i_1 = this->n_vertices + this->n_edges;
  for (i_2 = 0; i_2 < i_1; i_2 = i_2 + 1) {
    if (this->_outedges[i_2] != -1) {
      this->_outedges[i_2] = mapping[this->_outedges[i_2]];
    }
  }
  if (this->_inedges != (int *)0x0) {
    for (_k = 0; _k < i_1; _k = _k + 1) {
      if (this->_inedges[_k] != -1) {
        this->_inedges[_k] = mapping[this->_inedges[_k]];
      }
    }
  }
  piStack_18 = mapping;
  mapping_local = (int *)this;
  for (stack0xffffffffffffffc4 = 0; (long)stack0xffffffffffffffc4 < this->n_vertices;
      register0x00000000 = stack0xffffffffffffffc4 + 1) {
    while (piStack_18[stack0xffffffffffffffc4] != stack0xffffffffffffffc4) {
      local_58._24_4_ = piStack_18[stack0xffffffffffffffc4];
      piStack_18[stack0xffffffffffffffc4] = piStack_18[(int)local_58._24_4_];
      piStack_18[(int)local_58._24_4_] = local_58._24_4_;
      std::swap<int>(this->_priority + stack0xffffffffffffffc4,
                     this->_priority + (int)local_58._24_4_);
      bitset::operator[]((bitset *)local_58,(size_t)&this->_owner);
      local_58[0x17] = bitset::reference::operator_cast_to_bool((reference *)local_58);
      bitset::operator[]((bitset *)local_68,(size_t)&this->_owner);
      bitset::operator[]((bitset *)local_78,(size_t)&this->_owner);
      bitset::reference::operator=((reference *)local_78,(reference *)local_68);
      bVar1 = local_58[0x17];
      bitset::operator[]((bitset *)local_88,(size_t)&this->_owner);
      bitset::reference::operator=((reference *)local_88,(bool)(bVar1 & 1));
      std::swap<std::__cxx11::string*>
                (this->_label + stack0xffffffffffffffc4,this->_label + (int)local_58._24_4_);
      std::swap<int>(this->_firstouts + stack0xffffffffffffffc4,
                     this->_firstouts + (int)local_58._24_4_);
      std::swap<int>(this->_outcount + stack0xffffffffffffffc4,
                     this->_outcount + (int)local_58._24_4_);
      if (this->_inedges != (int *)0x0) {
        std::swap<int>(this->_firstins + stack0xffffffffffffffc4,
                       this->_firstins + (int)local_58._24_4_);
        std::swap<int>(this->_incount + stack0xffffffffffffffc4,
                       this->_incount + (int)local_58._24_4_);
      }
      bitset::operator[]((bitset *)local_a0,(size_t)&this->solved);
      local_a0[0x17] = bitset::reference::operator_cast_to_bool((reference *)local_a0);
      bitset::operator[]((bitset *)local_b0,(size_t)&this->solved);
      bitset::operator[]((bitset *)local_c0,(size_t)&this->solved);
      bitset::reference::operator=((reference *)local_c0,(reference *)local_b0);
      bVar1 = local_a0[0x17];
      bitset::operator[]((bitset *)local_d0,(size_t)&this->solved);
      bitset::reference::operator=((reference *)local_d0,(bool)(bVar1 & 1));
      bitset::operator[]((bitset *)local_e8,(size_t)&this->winner);
      local_e8[0x17] = bitset::reference::operator_cast_to_bool((reference *)local_e8);
      bitset::operator[]((bitset *)local_f8,(size_t)&this->winner);
      bitset::operator[]((bitset *)local_108,(size_t)&this->winner);
      bitset::reference::operator=((reference *)local_108,(reference *)local_f8);
      bVar1 = local_e8[0x17];
      bitset::operator[]((bitset *)local_118,(size_t)&this->winner);
      bitset::reference::operator=((reference *)local_118,(bool)(bVar1 & 1));
      std::swap<int>(this->strategy + stack0xffffffffffffffc4,this->strategy + (int)local_58._24_4_)
      ;
    }
  }
  return;
}

Assistant:

void
Game::unsafe_permute(int *mapping)
{
    // first update vectors and arrays and the strategies
    for (int i=0; i<n_vertices; i++) {
        if (strategy[i] != -1) strategy[i] = mapping[strategy[i]];
    }
    unsigned long len = n_vertices + n_edges;
    for (unsigned long i=0; i<len; i++) {
        if (_outedges[i] != -1) _outedges[i] = mapping[_outedges[i]];
    }
    if (_inedges != NULL) {
        for (unsigned long i=0; i<len; i++) {
            if (_inedges[i] != -1) _inedges[i] = mapping[_inedges[i]];
        }
    }
    // swap nodes until done
    for (int i=0; i<n_vertices; i++) {
        // this is basically a loop, that swaps mapping[i] and i, until mapping[i] equals i.
        while (mapping[i] != i) {
            int k = mapping[i];
            mapping[i] = mapping[k];
            mapping[k] = k;
            // swap i and k
            std::swap(_priority[i], _priority[k]);
            { bool b = _owner[k]; _owner[k] = _owner[i]; _owner[i] = b; }
            std::swap(_label[i], _label[k]);
            // swap out array
            std::swap(_firstouts[i], _firstouts[k]);
            std::swap(_outcount[i], _outcount[k]);
            // swap in array
            if (_inedges != NULL) {
                std::swap(_firstins[i], _firstins[k]);
                std::swap(_incount[i], _incount[k]);
            }
            // swap solution
            { bool b = solved[k]; solved[k] = solved[i]; solved[i] = b; }
            { bool b = winner[k]; winner[k] = winner[i]; winner[i] = b; }
            std::swap(strategy[i], strategy[k]);
        }
    }
}